

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

CreateSignatureHashRequestStruct * __thiscall
cfd::js::api::json::CreateSignatureHashRequest::ConvertToStruct
          (CreateSignatureHashRequestStruct *__return_storage_ptr__,CreateSignatureHashRequest *this
          )

{
  CreateSignatureHashTxInRequestStruct local_130;
  
  CreateSignatureHashRequestStruct::CreateSignatureHashRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  CreateSignatureHashTxInRequest::ConvertToStruct(&local_130,&this->txin_);
  CreateSignatureHashTxInRequestStruct::operator=(&__return_storage_ptr__->txin,&local_130);
  CreateSignatureHashTxInRequestStruct::~CreateSignatureHashTxInRequestStruct(&local_130);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

CreateSignatureHashRequestStruct CreateSignatureHashRequest::ConvertToStruct() const {  // NOLINT
  CreateSignatureHashRequestStruct result;
  result.tx = tx_;
  result.txin = txin_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}